

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::res_exists(uint argc)

{
  CVmHostIfc *pCVar1;
  int iVar2;
  char *p;
  int result;
  char *res_name;
  
  CVmBif::check_argc(0,0x303976);
  p = CVmBif::pop_str_val();
  pCVar1 = G_host_ifc_X;
  iVar2 = ::osrp2(p);
  (*pCVar1->_vptr_CVmHostIfc[0x10])(pCVar1,p + 2,(long)iVar2);
  CVmBif::retval_bool(0);
  return;
}

Assistant:

void CVmBifTIO::res_exists(VMG_ uint argc)
{
    const char *res_name;
    int result;

    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* pop the resource name */
    res_name = pop_str_val(vmg0_);

    /* ask the host application if the resource can be loaded */
    result = G_host_ifc->resfile_exists(res_name + VMB_LEN, osrp2(res_name));

    /* return the result */
    retval_bool(vmg_ result);
}